

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

IGeneratorTracker * __thiscall
Catch::RunContext::acquireGeneratorTracker
          (RunContext *this,StringRef generatorName,SourceLineInfo *lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  GeneratorTracker *pGVar3;
  long *local_78;
  long local_70;
  long local_68 [2];
  NameAndLocation local_58;
  
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,generatorName.m_start,generatorName.m_start + generatorName.m_size)
  ;
  paVar1 = &local_58.name.field_2;
  local_58.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_70 + (long)local_78);
  local_58.location.file = lineInfo->file;
  local_58.location.line = lineInfo->line;
  pGVar3 = Generators::GeneratorTracker::acquire(&this->m_trackerContext,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.name._M_dataplus._M_p,local_58.name.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  sVar2 = lineInfo->line;
  (this->m_lastAssertionInfo).lineInfo.file = lineInfo->file;
  (this->m_lastAssertionInfo).lineInfo.line = sVar2;
  return &pGVar3->super_IGeneratorTracker;
}

Assistant:

auto RunContext::acquireGeneratorTracker(StringRef generatorName, SourceLineInfo const &lineInfo) -> IGeneratorTracker &{
        using namespace Generators;
        GeneratorTracker &tracker = GeneratorTracker::acquire(m_trackerContext,
            TestCaseTracking::NameAndLocation(static_cast<std::string>(generatorName), lineInfo));
        m_lastAssertionInfo.lineInfo = lineInfo;
        return tracker;
    }